

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

int Of_CutRef_rec(Of_Man_t *p,int *pCut)

{
  uint uVar1;
  Of_Obj_t *pOVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  uVar3 = *pCut & 0x1f;
  iVar5 = 1;
  if (((p->Iter & 1) == 0) && (iVar5 = 0, 1 < uVar3)) {
    iVar5 = uVar3 + p->pPars->nAreaTuner;
  }
  else if (uVar3 == 0) {
    return iVar5;
  }
  uVar6 = 0;
  do {
    uVar3 = pCut[uVar6 + 1];
    if ((int)uVar3 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf2,"int Abc_Lit2Var(int)");
    }
    if (uVar3 < 2) {
      return iVar5;
    }
    uVar3 = uVar3 >> 1;
    pOVar2 = p->pObjs;
    uVar1 = pOVar2[uVar3].iCutH;
    if ((uVar1 != 0) && (iVar4 = pOVar2[uVar3].nRefs, pOVar2[uVar3].nRefs = iVar4 + 1, iVar4 == 0))
    {
      if (p->pGia->nObjs <= (int)uVar3) {
        __assert_fail("iObj>0 && iObj<Gia_ManObjNum(p->pGia)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                      ,0x90,"int *Of_ObjCutBestP(Of_Man_t *, int)");
      }
      uVar3 = (int)uVar1 >> 0x10;
      if (((int)uVar3 < 0) || ((p->vPages).nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar4 = Of_CutRef_rec(p,(int *)((ulong)((uVar1 & 0xffff) << 2) +
                                     (long)(p->vPages).pArray[uVar3]));
      iVar5 = iVar5 + iVar4;
    }
    uVar6 = uVar6 + 1;
    if ((*pCut & 0x1f) <= uVar6) {
      return iVar5;
    }
  } while( true );
}

Assistant:

int Of_CutRef_rec( Of_Man_t * p, int * pCut )
{
    int i, Var, Count = (p->Iter & 1) ? 1 : Of_CutArea(p, Of_CutSize(pCut));
    Of_CutForEachVar( pCut, Var, i )
        if ( Of_ObjCutBest(p, Var) && !Of_ObjRefInc(p, Var) )
            Count += Of_CutRef_rec( p, Of_ObjCutBestP(p, Var) );
    return Count;
}